

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::
map_caster<std::unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>,_kratos::Stmt_*,_unsigned_int>
::load(map_caster<std::unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>,_kratos::Stmt_*,_unsigned_int>
       *this,handle src,bool convert)

{
  handle src_00;
  PyObject *src_01;
  bool bVar1;
  bool bVar2;
  undefined1 local_88 [8];
  key_conv kconv;
  dict_iterator __begin3;
  handle local_48;
  dict d;
  type_caster<unsigned_int,_void> local_34 [2];
  value_conv vconv;
  
  if ((src.m_ptr == (PyObject *)0x0) || (((src.m_ptr)->ob_type->tp_flags & 0x20000000) == 0)) {
    bVar2 = false;
  }
  else {
    (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
    local_48.m_ptr = src.m_ptr;
    d.super_object.super_handle.m_ptr = (object)(object)this;
    std::
    _Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_unsigned_int>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear((_Hashtable<kratos::Stmt_*,_std::pair<kratos::Stmt_*const,_unsigned_int>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Stmt_*>,_std::hash<kratos::Stmt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)this);
    dict::begin((dict_iterator *)
                &kconv.super_type_caster_base<kratos::Stmt>.super_type_caster_generic.value,
                (dict *)&local_48);
    while (src_01 = __begin3.super_dict_readonly.key,
          src_00.m_ptr = __begin3.super_dict_readonly.obj.m_ptr,
          bVar2 = __begin3.super_dict_readonly.value == (PyObject *)0xffffffffffffffff, !bVar2) {
      type_caster_base<kratos::Stmt>::type_caster_base((type_caster_base<kratos::Stmt> *)local_88);
      bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                        ((type_caster_generic *)local_88,src_00,convert);
      if (!bVar1) break;
      bVar1 = type_caster<unsigned_int,_void>::load(local_34,(handle)src_01,convert);
      if (!bVar1) break;
      __begin3.super_dict_readonly.pos =
           (ssize_t)kconv.super_type_caster_base<kratos::Stmt>.super_type_caster_generic.cpptype;
      std::
      _Hashtable<kratos::Stmt*,std::pair<kratos::Stmt*const,unsigned_int>,std::allocator<std::pair<kratos::Stmt*const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt*>,std::hash<kratos::Stmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<kratos::Stmt*,unsigned_int>
                ((_Hashtable<kratos::Stmt*,std::pair<kratos::Stmt*const,unsigned_int>,std::allocator<std::pair<kratos::Stmt*const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<kratos::Stmt*>,std::hash<kratos::Stmt*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)d.super_object.super_handle.m_ptr,&__begin3.super_dict_readonly.pos,local_34);
      iterator_policies::dict_readonly::increment
                ((dict_readonly *)
                 &kconv.super_type_caster_base<kratos::Stmt>.super_type_caster_generic.value);
    }
    object::~object((object *)&local_48);
  }
  return bVar2;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<dict>(src))
            return false;
        auto d = reinterpret_borrow<dict>(src);
        value.clear();
        for (auto it : d) {
            key_conv kconv;
            value_conv vconv;
            if (!kconv.load(it.first.ptr(), convert) ||
                !vconv.load(it.second.ptr(), convert))
                return false;
            value.emplace(cast_op<Key &&>(std::move(kconv)), cast_op<Value &&>(std::move(vconv)));
        }
        return true;
    }